

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXF.cpp
# Opt level: O2

MXF * __thiscall ASDCP::MXF::SeekToRIP(MXF *this,IFileReader *Reader)

{
  ILogSink *pIVar1;
  ulong uVar2;
  undefined1 *this_00;
  fpos_t end_pos;
  byte_t intbuf [4];
  ui32_t read_count;
  Result_t local_e8 [104];
  Result_t result;
  
  this_00 = &result;
  (**(code **)(*(long *)Reader + 0x28))(this_00,Reader,0,2);
  if (-1 < _result) {
    (**(code **)(*(long *)Reader + 0x30))(local_e8,Reader,&end_pos);
    Kumu::Result_t::operator=(&result,local_e8);
    Kumu::Result_t::~Result_t(local_e8);
    if ((-1 < _result) && (end_pos < 0x14)) {
      pIVar1 = (ILogSink *)Kumu::DefaultLogSink();
      Kumu::ILogSink::Error(pIVar1,"File is smaller than an empty KLV packet.\n");
      Kumu::Result_t::operator=(&result,(Result_t *)Kumu::RESULT_FAIL);
    }
    if (-1 < _result) {
      (**(code **)(*(long *)Reader + 0x28))(local_e8,Reader,end_pos + -4,0);
      this_00 = &result;
      Kumu::Result_t::operator=((Result_t *)this_00,local_e8);
      Kumu::Result_t::~Result_t(local_e8);
      if (-1 < _result) {
        (**(code **)(*(long *)Reader + 0x38))(local_e8,Reader,intbuf,4,&read_count);
        this_00 = &result;
        Kumu::Result_t::operator=((Result_t *)this_00,local_e8);
        Kumu::Result_t::~Result_t(local_e8);
        if ((-1 < _result) && (read_count != 4)) {
          pIVar1 = (ILogSink *)Kumu::DefaultLogSink();
          Kumu::ILogSink::Error(pIVar1,"RIP contains fewer than four bytes.\n");
          Kumu::Result_t::operator=(&result,(Result_t *)Kumu::RESULT_FAIL);
        }
        if (-1 < _result) {
          uVar2 = (ulong)((uint)intbuf >> 0x18 | ((uint)intbuf & 0xff0000) >> 8 |
                          ((uint)intbuf & 0xff00) << 8 | (int)intbuf << 0x18);
          if (end_pos < (long)uVar2) {
            pIVar1 = (ILogSink *)Kumu::DefaultLogSink();
            Kumu::ILogSink::Error(pIVar1,"RIP size impossibly large.\n");
            this_00 = Kumu::RESULT_FAIL;
          }
          else {
            (**(code **)(*(long *)Reader + 0x28))(local_e8,Reader,end_pos - uVar2,0);
            this_00 = &result;
            Kumu::Result_t::operator=((Result_t *)this_00,local_e8);
            Kumu::Result_t::~Result_t(local_e8);
          }
        }
      }
    }
  }
  Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)this_00);
  Kumu::Result_t::~Result_t(&result);
  return this;
}

Assistant:

ASDCP::Result_t
ASDCP::MXF::SeekToRIP(const Kumu::IFileReader& Reader)
{
  Kumu::fpos_t end_pos;

  // go to the end - 4 bytes
  Result_t result = Reader.Seek(0, Kumu::SP_END);

  if ( ASDCP_SUCCESS(result) )
    result = Reader.Tell(&end_pos);

  if ( ASDCP_SUCCESS(result)
       && end_pos < (SMPTE_UL_LENGTH+MXF_BER_LENGTH) )
    {
      DefaultLogSink().Error("File is smaller than an empty KLV packet.\n");
      result = RESULT_FAIL;
    }

  if ( ASDCP_SUCCESS(result) )
    result = Reader.Seek(end_pos - 4);

  // get the ui32_t RIP length
  ui32_t read_count;
  byte_t intbuf[MXF_BER_LENGTH];
  ui32_t rip_size = 0;

  if ( ASDCP_SUCCESS(result) )
    {
      result = Reader.Read(intbuf, MXF_BER_LENGTH, &read_count);

      if ( ASDCP_SUCCESS(result) && read_count != 4 )
	{
	  DefaultLogSink().Error("RIP contains fewer than four bytes.\n");
	  result = RESULT_FAIL;
	}
    }

  if ( ASDCP_SUCCESS(result) )
    {
      rip_size = KM_i32_BE(Kumu::cp2i<ui32_t>(intbuf));

      if ( rip_size > end_pos ) // RIP can't be bigger than the file
	{
	  DefaultLogSink().Error("RIP size impossibly large.\n");
	  return RESULT_FAIL;
	}
    }

  // reposition to start of RIP
  if ( ASDCP_SUCCESS(result) )
    result = Reader.Seek(end_pos - rip_size);

  return result;
}